

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::AppendCatch(BinaryReaderIR *this,Catch *catch_)

{
  pointer pLVar1;
  pointer pLVar2;
  long lVar3;
  long lVar4;
  char *format;
  int *piVar5;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pLVar2 - (long)pLVar1;
  if (lVar4 == 0) {
    piVar5 = (int *)0x0;
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
  }
  else {
    piVar5 = (int *)((long)pLVar1 + lVar4 + -0x18);
  }
  if (pLVar2 == pLVar1) {
    return (Result)Error;
  }
  if (*piVar5 == 6) {
    lVar4 = *(long *)(piVar5 + 4);
    if (*(int *)(lVar4 + 0x38) != 0x3d) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x4e,"Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]"
                   );
    }
    if (((((catch_->var).type_ != Index) || ((catch_->var).field_2.index_ != 0xffffffff)) ||
        (lVar3 = *(long *)(lVar4 + 0x120), *(long *)(lVar4 + 0x118) == lVar3)) ||
       ((*(int *)(lVar3 + -0x40) != 0 || (*(int *)(lVar3 + -0x38) != -1)))) {
      if (*(int *)(lVar4 + 0x3c) != 1) {
        if (*(int *)(lVar4 + 0x3c) != 0) {
          format = "catch not allowed in try-delegate";
          goto LAB_0013806d;
        }
        *(undefined4 *)(lVar4 + 0x3c) = 1;
      }
      std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                ((vector<wabt::Catch,_std::allocator<wabt::Catch>_> *)(lVar4 + 0x118),catch_);
      *(long *)(piVar5 + 2) = *(long *)(lVar4 + 0x120) + -0x18;
      return (Result)Ok;
    }
    format = "only one catch_all allowed in try block";
  }
  else {
    format = "catch not inside try block";
  }
LAB_0013806d:
  PrintError(this,format);
  return (Result)Error;
}

Assistant:

Result BinaryReaderIR::AppendCatch(Catch&& catch_) {
  LabelNode* label = nullptr;
  CHECK_RESULT(TopLabel(&label));

  if (label->label_type != LabelType::Try) {
    PrintError("catch not inside try block");
    return Result::Error;
  }

  auto* try_ = cast<TryExpr>(label->context);

  if (catch_.IsCatchAll() && !try_->catches.empty() &&
      try_->catches.back().IsCatchAll()) {
    PrintError("only one catch_all allowed in try block");
    return Result::Error;
  }

  if (try_->kind == TryKind::Plain) {
    try_->kind = TryKind::Catch;
  } else if (try_->kind != TryKind::Catch) {
    PrintError("catch not allowed in try-delegate");
    return Result::Error;
  }

  try_->catches.push_back(std::move(catch_));
  label->exprs = &try_->catches.back().exprs;
  return Result::Ok;
}